

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalDlPhraseNext(Fts3Table *pTab,Fts3Doclist *pDL,u8 *pbEof)

{
  int iVar1;
  bool bVar2;
  long local_38;
  sqlite3_int64 iDelta;
  char *pEnd;
  char *pIter;
  u8 *pbEof_local;
  Fts3Doclist *pDL_local;
  Fts3Table *pTab_local;
  
  iDelta = (sqlite3_int64)(pDL->aAll + pDL->nAll);
  if (pDL->pNextDocid == (char *)0x0) {
    pEnd = pDL->aAll;
  }
  else {
    pEnd = pDL->pNextDocid;
  }
  if (pEnd < (ulong)iDelta) {
    pIter = (char *)pbEof;
    pbEof_local = (u8 *)pDL;
    pDL_local = (Fts3Doclist *)pTab;
    iVar1 = sqlite3Fts3GetVarint(pEnd,&local_38);
    pEnd = pEnd + iVar1;
    if ((*(char *)((long)&pDL_local[8].aAll + 7) == '\0') || (*(long *)(pbEof_local + 0x10) == 0)) {
      *(long *)(pbEof_local + 0x18) = local_38 + *(long *)(pbEof_local + 0x18);
    }
    else {
      *(long *)(pbEof_local + 0x18) = *(long *)(pbEof_local + 0x18) - local_38;
    }
    *(char **)(pbEof_local + 0x28) = pEnd;
    fts3PoslistCopy((char **)0x0,&pEnd);
    *(int *)(pbEof_local + 0x30) = (int)pEnd - (int)*(undefined8 *)(pbEof_local + 0x28);
    while( true ) {
      bVar2 = false;
      if (pEnd < (ulong)iDelta) {
        bVar2 = *pEnd == '\0';
      }
      if (!bVar2) break;
      pEnd = pEnd + 1;
    }
    *(char **)(pbEof_local + 0x10) = pEnd;
    *pIter = '\0';
  }
  else {
    *pbEof = '\x01';
  }
  return;
}

Assistant:

static void fts3EvalDlPhraseNext(
  Fts3Table *pTab,
  Fts3Doclist *pDL,
  u8 *pbEof
){
  char *pIter;                            /* Used to iterate through aAll */
  char *pEnd = &pDL->aAll[pDL->nAll];     /* 1 byte past end of aAll */
 
  if( pDL->pNextDocid ){
    pIter = pDL->pNextDocid;
  }else{
    pIter = pDL->aAll;
  }

  if( pIter>=pEnd ){
    /* We have already reached the end of this doclist. EOF. */
    *pbEof = 1;
  }else{
    sqlite3_int64 iDelta;
    pIter += sqlite3Fts3GetVarint(pIter, &iDelta);
    if( pTab->bDescIdx==0 || pDL->pNextDocid==0 ){
      pDL->iDocid += iDelta;
    }else{
      pDL->iDocid -= iDelta;
    }
    pDL->pList = pIter;
    fts3PoslistCopy(0, &pIter);
    pDL->nList = (int)(pIter - pDL->pList);

    /* pIter now points just past the 0x00 that terminates the position-
    ** list for document pDL->iDocid. However, if this position-list was
    ** edited in place by fts3EvalNearTrim(), then pIter may not actually
    ** point to the start of the next docid value. The following line deals
    ** with this case by advancing pIter past the zero-padding added by
    ** fts3EvalNearTrim().  */
    while( pIter<pEnd && *pIter==0 ) pIter++;

    pDL->pNextDocid = pIter;
    assert( pIter>=&pDL->aAll[pDL->nAll] || *pIter );
    *pbEof = 0;
  }
}